

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.cpp
# Opt level: O2

void duckdb::ComparesNotNull
               (UnifiedVectorFormat *ldata,UnifiedVectorFormat *rdata,ValidityMask *vresult,
               idx_t count)

{
  sel_t *psVar1;
  bool bVar2;
  idx_t i;
  idx_t row_idx;
  idx_t row_idx_00;
  idx_t row_idx_01;
  
  row_idx = 0;
  do {
    if (count == row_idx) {
      return;
    }
    psVar1 = ldata->sel->sel_vector;
    row_idx_00 = row_idx;
    if (psVar1 != (sel_t *)0x0) {
      row_idx_00 = (idx_t)psVar1[row_idx];
    }
    psVar1 = rdata->sel->sel_vector;
    row_idx_01 = row_idx;
    if (psVar1 != (sel_t *)0x0) {
      row_idx_01 = (idx_t)psVar1[row_idx];
    }
    bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(ldata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx_00);
    if (bVar2) {
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(rdata->validity).super_TemplatedValidityMask<unsigned_long>,row_idx_01);
      if (!bVar2) goto LAB_01313345;
    }
    else {
LAB_01313345:
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&vresult->super_TemplatedValidityMask<unsigned_long>,row_idx);
    }
    row_idx = row_idx + 1;
  } while( true );
}

Assistant:

static void ComparesNotNull(UnifiedVectorFormat &ldata, UnifiedVectorFormat &rdata, ValidityMask &vresult,
                            idx_t count) {
	for (idx_t i = 0; i < count; ++i) {
		auto lidx = ldata.sel->get_index(i);
		auto ridx = rdata.sel->get_index(i);
		if (!ldata.validity.RowIsValid(lidx) || !rdata.validity.RowIsValid(ridx)) {
			vresult.SetInvalid(i);
		}
	}
}